

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O2

bool NurbsCurveArc(ON_Arc *arc,int dim,ON_NurbsCurve *nurb)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  ON_3dPoint *pOVar7;
  double *pdVar8;
  ON_4dPoint *pOVar9;
  double *pdVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  ON_Interval OVar18;
  long lStack_240;
  ON_3dPoint end_point;
  double knot [10];
  ON_3dPoint start_point;
  ON_4dPoint CV [9];
  ON_Interval dom;
  
  bVar5 = ON_Arc::IsValid(arc);
  if (bVar5) {
    pOVar7 = ON_Circle::Center(&arc->super_ON_Circle);
    dVar16 = pOVar7->x;
    dVar4 = pOVar7->y;
    dVar1 = pOVar7->z;
    dVar3 = ON_Arc::AngleRadians(arc);
    OVar18 = ON_Arc::DomainRadians(arc);
    dom.m_t[1] = OVar18.m_t[1];
    dom.m_t[0] = OVar18.m_t[0];
    pdVar8 = ON_Interval::operator[](&dom,0);
    dVar17 = *pdVar8;
    pdVar8 = ON_Interval::operator[](&dom,1);
    dVar2 = *pdVar8;
    ON_Arc::StartPoint(&start_point,arc);
    bVar6 = ON_Arc::IsCircle(arc);
    if (bVar6) {
      end_point.z = start_point.z;
      end_point.x = start_point.x;
      end_point.y = start_point.y;
    }
    else {
      ON_Arc::EndPoint(&end_point,arc);
    }
    uVar13 = 4;
    if (dVar3 <= 1.570796373608275) {
      ON_4dPoint::operator=(CV,&start_point);
      ON_Circle::PointAt((ON_3dPoint *)knot,&arc->super_ON_Circle,dVar3 * 0.5 + dVar17);
      ON_4dPoint::operator=(CV + 1,(ON_3dPoint *)knot);
      ON_4dPoint::operator=(CV + 2,&end_point);
      uVar13 = 2;
      lStack_240 = 3;
      dVar14 = dVar3;
    }
    else {
      ON_4dPoint::operator=(CV,&start_point);
      if (dVar3 <= 3.14159274721655) {
        ON_Circle::PointAt((ON_3dPoint *)knot,&arc->super_ON_Circle,dVar3 * 0.25 + dVar17);
        ON_4dPoint::operator=(CV + 1,(ON_3dPoint *)knot);
        dVar14 = dVar3 * 0.5;
        ON_Circle::PointAt((ON_3dPoint *)knot,&arc->super_ON_Circle,dVar14 + dVar17);
        ON_4dPoint::operator=(CV + 2,(ON_3dPoint *)knot);
        ON_Circle::PointAt((ON_3dPoint *)knot,&arc->super_ON_Circle,dVar3 * 0.75 + dVar17);
        ON_4dPoint::operator=(CV + 3,(ON_3dPoint *)knot);
        ON_4dPoint::operator=(CV + 4,&end_point);
        lStack_240 = 5;
      }
      else {
        ON_Circle::PointAt((ON_3dPoint *)knot,&arc->super_ON_Circle,dVar3 * 0.125 + dVar17);
        ON_4dPoint::operator=(CV + 1,(ON_3dPoint *)knot);
        dVar14 = dVar3 * 0.25;
        ON_Circle::PointAt((ON_3dPoint *)knot,&arc->super_ON_Circle,dVar14 + dVar17);
        ON_4dPoint::operator=(CV + 2,(ON_3dPoint *)knot);
        ON_Circle::PointAt((ON_3dPoint *)knot,&arc->super_ON_Circle,dVar3 * 0.375 + dVar17);
        ON_4dPoint::operator=(CV + 3,(ON_3dPoint *)knot);
        ON_Circle::PointAt((ON_3dPoint *)knot,&arc->super_ON_Circle,dVar3 * 0.5 + dVar17);
        ON_4dPoint::operator=(CV + 4,(ON_3dPoint *)knot);
        ON_Circle::PointAt((ON_3dPoint *)knot,&arc->super_ON_Circle,dVar3 * 0.625 + dVar17);
        ON_4dPoint::operator=(CV + 5,(ON_3dPoint *)knot);
        ON_Circle::PointAt((ON_3dPoint *)knot,&arc->super_ON_Circle,dVar3 * 0.75 + dVar17);
        ON_4dPoint::operator=(CV + 6,(ON_3dPoint *)knot);
        ON_Circle::PointAt((ON_3dPoint *)knot,&arc->super_ON_Circle,dVar3 * 0.875 + dVar17);
        ON_4dPoint::operator=(CV + 7,(ON_3dPoint *)knot);
        ON_4dPoint::operator=(CV + 8,&end_point);
        uVar13 = 8;
        lStack_240 = 9;
      }
    }
    dVar3 = cos(dVar14 * 0.5);
    dVar15 = dVar3 + -1.0;
    knot[1] = dVar17;
    knot[0] = dVar17;
    pOVar9 = CV + 1;
    for (uVar11 = 1; uVar11 < uVar13; uVar11 = uVar11 + 2) {
      pOVar9->x = pOVar9->x + dVar15 * dVar16;
      pOVar9->y = pOVar9->y + dVar15 * dVar4;
      pOVar9->z = pOVar9->z + dVar15 * dVar1;
      pOVar9->w = dVar3;
      pOVar9[1].w = 1.0;
      dVar17 = dVar17 + dVar14;
      knot[uVar11 + 2] = dVar17;
      knot[uVar11 + 1] = dVar17;
      pOVar9 = pOVar9 + 2;
    }
    knot[lStack_240] = dVar2;
    knot[uVar13] = dVar2;
    pOVar9 = CV + 1;
    for (uVar11 = 1; uVar11 < uVar13; uVar11 = uVar11 + 2) {
      dVar1 = pOVar9->w;
      dVar17 = 1.0 / dVar1;
      dVar16 = pOVar9->x * dVar17;
      dVar3 = ArcDeFuzz(dVar16);
      if ((dVar16 != dVar3) || (NAN(dVar16) || NAN(dVar3))) {
        pOVar9->x = dVar3 * dVar1;
      }
      dVar3 = pOVar9->y * dVar17;
      dVar16 = ArcDeFuzz(dVar3);
      if ((dVar3 != dVar16) || (NAN(dVar3) || NAN(dVar16))) {
        pOVar9->y = dVar16 * dVar1;
      }
      dVar17 = dVar17 * pOVar9->z;
      dVar3 = ArcDeFuzz(dVar17);
      if ((dVar17 != dVar3) || (NAN(dVar17) || NAN(dVar3))) {
        pOVar9->z = dVar1 * dVar3;
      }
      pOVar9 = pOVar9 + 2;
    }
    iVar12 = 4 - (uint)(dim == 2);
    nurb->m_dim = dim == 2 ^ 3;
    nurb->m_is_rat = 1;
    nurb->m_order = 3;
    nurb->m_cv_count = (int)lStack_240;
    nurb->m_cv_stride = iVar12;
    ON_NurbsCurve::ReserveCVCapacity(nurb,iVar12 * (int)lStack_240);
    ON_NurbsCurve::ReserveKnotCapacity(nurb,(uint)uVar13 + 2);
    pdVar8 = &CV[0].w;
    for (uVar11 = 0; ((uint)uVar13 | 1) != uVar11; uVar11 = uVar11 + 1) {
      pdVar10 = ON_NurbsCurve::CV(nurb,(int)uVar11);
      *pdVar10 = ((ON_4dPoint *)(pdVar8 + -3))->x;
      pdVar10[1] = pdVar8[-2];
      if (dim == 2) {
        pdVar10[2] = *pdVar8;
      }
      else {
        pdVar10[2] = pdVar8[-1];
        pdVar10[3] = *pdVar8;
      }
      nurb->m_knot[uVar11] = knot[uVar11];
      pdVar8 = pdVar8 + 4;
    }
    nurb->m_knot[lStack_240] = dVar2;
  }
  return bVar5;
}

Assistant:

static bool NurbsCurveArc ( const ON_Arc& arc, int dim, ON_NurbsCurve& nurb )
{ 
  if ( !arc.IsValid() )
    return false;
  // makes a quadratic nurbs arc
  const ON_3dPoint center = arc.Center();
  double angle = arc.AngleRadians();
  ON_Interval dom = arc.DomainRadians();
  const double angle0 = dom[0];
  const double angle1 = dom[1];
  ON_3dPoint start_point = arc.StartPoint();
  //ON_3dPoint mid_point   = arc.PointAt(angle0 + 0.5*angle);
  ON_3dPoint end_point   = arc.IsCircle() ? start_point : arc.EndPoint();

  ON_4dPoint CV[9];
  double knot[10];

	double a, b, c, w, winv;
	double *cv;
	int    j, span_count, cv_count;

	a = (0.5 + ON_SQRT_EPSILON)*ON_PI;

	if (angle <= a)
		span_count = 1;
	else if (angle <= 2.0*a)
		span_count = 2;
	else if (angle <= 3.0*a)
		span_count = 4; // TODO - make a 3 span case
	else
		span_count = 4;

	cv_count = 2*span_count + 1;
	
	switch(span_count) {
	case 1:
    CV[0] = start_point;
    CV[1] = arc.PointAt(angle0 + 0.50*angle);
    CV[2] = end_point;
		break;
	case 2:
    CV[0] = start_point;
    CV[1] = arc.PointAt(angle0 + 0.25*angle);
    CV[2] = arc.PointAt(angle0 + 0.50*angle);
    CV[3] = arc.PointAt(angle0 + 0.75*angle);
    CV[4] = end_point;
		angle *= 0.5;
		break;
	default: // 4 spans
    CV[0] = start_point;
    CV[1] = arc.PointAt(angle0 + 0.125*angle);
    CV[2] = arc.PointAt(angle0 + 0.250*angle);
    CV[3] = arc.PointAt(angle0 + 0.375*angle);
    CV[4] = arc.PointAt(angle0 + 0.500*angle);
    CV[5] = arc.PointAt(angle0 + 0.625*angle);
    CV[6] = arc.PointAt(angle0 + 0.750*angle);
    CV[7] = arc.PointAt(angle0 + 0.875*angle);
    CV[8] = end_point;
		angle *= 0.25;
		break;
	}

	a = cos(0.5*angle);
	b = a - 1.0;
	//c = (radius > 0.0) ? radius*angle : angle;
  c = angle;

	span_count *= 2;
	knot[0] = knot[1] = angle0; //0.0;
	for (j = 1; j < span_count; j += 2) {
    CV[j].x += b * center.x;
    CV[j].y += b * center.y;
    CV[j].z += b * center.z;
    CV[j].w = a;
		CV[j+1].w = 1.0;
		knot[j+1] = knot[j+2] = knot[j-1] + c;
	}
  knot[cv_count-1] = knot[cv_count] = angle1;
  for ( j = 1; j < span_count; j += 2 ) {
    w = CV[j].w;
    winv = 1.0/w;
    a = CV[j].x*winv;
    b = ArcDeFuzz(a);
    if ( a != b ) {
      CV[j].x = b*w;
    }
    a = CV[j].y*winv;
    b = ArcDeFuzz(a);
    if ( a != b ) {
      CV[j].y = b*w;
    }
    a = CV[j].z*winv;
    b = ArcDeFuzz(a);
    if ( a != b ) {
      CV[j].z = b*w;
    }
  }

  nurb.m_dim = (dim==2) ? 2 : 3;
  nurb.m_is_rat = 1;
  nurb.m_order = 3;
  nurb.m_cv_count = cv_count;
  nurb.m_cv_stride = (dim==2 ? 3 : 4);
  nurb.ReserveCVCapacity( nurb.m_cv_stride*cv_count );
  nurb.ReserveKnotCapacity( cv_count+1 );
  for ( j = 0; j < cv_count; j++ ) {
    cv = nurb.CV(j);
    cv[0] = CV[j].x;
    cv[1] = CV[j].y;
    if ( dim == 2 ) {
      cv[2] = CV[j].w;
    }
    else {
      cv[2] = CV[j].z;
      cv[3] = CV[j].w;
    }
    nurb.m_knot[j] = knot[j];
  }
  nurb.m_knot[cv_count] = knot[cv_count];
  return true;
}